

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O2

QVersionNumber from_string(QLatin1StringView string,qsizetype *suffixIndex)

{
  qsizetype *pqVar1;
  long *in_RCX;
  long lVar2;
  qsizetype *begin;
  qsizetype *pqVar3;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar4;
  int local_d4;
  undefined1 local_d0 [32];
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0._16_8_ = local_d0 + 0x18;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0._0_8_ = 0x20;
  local_d0._8_8_ = 0;
  pqVar3 = suffixIndex;
  begin = suffixIndex;
  while( true ) {
    QVar4 = qstrntoull((char *)begin,(long)(string.m_data + (long)suffixIndex) - (long)begin,10);
    lVar2 = QVar4.used;
    if ((lVar2 < 1) || (0x7fffffff < QVar4.result)) break;
    local_d4 = (int)QVar4.result;
    QVarLengthArray<int,_32LL>::emplace_back<int>((QVarLengthArray<int,_32LL> *)local_d0,&local_d4);
    pqVar1 = (qsizetype *)((long)begin + lVar2 + 1);
    pqVar3 = (qsizetype *)((long)begin + lVar2);
    if ((string.m_data + (long)suffixIndex <= pqVar1) || (begin = pqVar1, (char)*pqVar3 != '.'))
    break;
  }
  if (in_RCX != (long *)0x0) {
    *in_RCX = (long)pqVar3 - (long)suffixIndex;
  }
  QVersionNumber::SegmentStorage::SegmentStorage
            ((SegmentStorage *)string.m_size,(int *)local_d0._16_8_,
             (int *)(local_d0._16_8_ + local_d0._8_8_ * 4));
  QVarLengthArray<int,_32LL>::~QVarLengthArray((QVarLengthArray<int,_32LL> *)local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QVersionNumber)(anon_union_8_3_e50c5c22_for_SegmentStorage_0)string.m_size;
}

Assistant:

static QVersionNumber from_string(QLatin1StringView string, qsizetype *suffixIndex)
{
    // 32 should be more than enough, and, crucially, it means we're allocating
    // not more (and often less) often when compared with direct QList usage
    // for all possible segment counts (under the constraint that we don't want
    // to keep more capacity around for the lifetime of the resulting
    // QVersionNumber than required), esp. in the common case where the inline
    // storage can be used.
    QVarLengthArray<int, 32> seg;

    const char *start = string.begin();
    const char *lastGoodEnd = start;
    const char *endOfString = string.end();

    do {
        // parsing as unsigned so a minus sign is rejected
        auto [value, used] = qstrntoull(start, endOfString - start, 10);
        if (used <= 0 || value > qulonglong(std::numeric_limits<int>::max()))
            break;
        seg.append(int(value));
        start += used + 1;
        lastGoodEnd = start - 1;
    } while (start < endOfString && *lastGoodEnd == '.');

    if (suffixIndex)
        *suffixIndex = lastGoodEnd - string.begin();

    return QVersionNumber(seg);
}